

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::DirWatcherGeneric::watch(DirWatcherGeneric *this,bool reportOwnChange)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  bool bVar3;
  reference pFVar4;
  reference ppVar5;
  reference ppVar6;
  pointer ppVar7;
  _Self local_400;
  _Self local_3f8;
  iterator dit;
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
  local_388;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  *local_380;
  FileInfo *local_378;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
  local_328;
  FileInfo *local_320;
  FileInfo *local_318;
  allocator local_309;
  string local_308 [32];
  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
  local_2e8;
  FileInfo *local_2e0;
  FileInfo *local_2d8;
  string local_2d0 [32];
  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
  local_2b0;
  FileInfo *local_2a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  *local_2a0;
  string local_298 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
  local_278;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  *local_270;
  FileInfo *local_268;
  allocator local_259;
  string local_258 [32];
  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
  local_238;
  FileInfo *local_230;
  FileInfo *local_228;
  allocator local_219;
  string local_218 [32];
  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
  local_1f8;
  FileInfo *local_1f0;
  FileInfo *local_1e8;
  allocator local_1d9;
  string local_1d8 [32];
  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
  local_1b8;
  FileInfo *local_1b0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
  local_1a8;
  iterator mit;
  iterator it;
  string local_190 [32];
  string local_170 [32];
  FileSystem local_150 [48];
  string local_120 [32];
  FileSystem local_100 [32];
  undefined1 local_e0 [8];
  DirectorySnapshotDiff Diff;
  bool reportOwnChange_local;
  DirWatcherGeneric *this_local;
  
  Diff._199_1_ = reportOwnChange;
  DirectorySnapshot::scan((DirectorySnapshotDiff *)local_e0,&this->DirSnap);
  if ((((Diff._199_1_ & 1) != 0) &&
      (((byte)Diff.DirsMoved.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0)) &&
     (this->Parent != (DirWatcherGeneric *)0x0)) {
    WVar1 = (this->Watch->super_Watcher).ID;
    pFVar2 = (this->Watch->super_Watcher).Listener;
    std::__cxx11::string::string(local_120,(string *)&this->DirSnap);
    FileSystem::pathRemoveFileName(local_100,(string *)local_120);
    std::__cxx11::string::string(local_170,(string *)&this->DirSnap);
    FileSystem::fileNameFromPath(local_150,(string *)local_170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"",(allocator *)((long)&it._M_current + 7));
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,local_100,local_150,3,local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string(local_120);
  }
  bVar3 = DirectorySnapshotDiff::changed((DirectorySnapshotDiff *)local_e0);
  if (bVar3) {
    __gnu_cxx::
    __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
    ::__normal_iterator((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                         *)&mit);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
    ::__normal_iterator(&local_1a8);
    local_1b0 = (FileInfo *)
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.FilesDeleted.
                            super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    mit._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
          *)local_1b0;
    while( true ) {
      local_1b8._M_current =
           (FileInfo *)
           std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.FilesDeleted.
                       super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                          *)&mit,&local_1b8);
      if (!bVar3) break;
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"",&local_1d9);
      handleAction(this,&pFVar4->Filepath,1,(string *)local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      local_1e8 = (FileInfo *)
                  __gnu_cxx::
                  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                  ::operator++((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                                *)&mit,0);
    }
    local_1f0 = (FileInfo *)
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.FilesCreated.
                            super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    mit._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
          *)local_1f0;
    while( true ) {
      local_1f8._M_current =
           (FileInfo *)
           std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.FilesCreated.
                       super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                          *)&mit,&local_1f8);
      if (!bVar3) break;
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"",&local_219);
      handleAction(this,&pFVar4->Filepath,3,(string *)local_218);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      local_228 = (FileInfo *)
                  __gnu_cxx::
                  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                  ::operator++((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                                *)&mit,0);
    }
    local_230 = (FileInfo *)
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)local_e0);
    mit._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
          *)local_230;
    while( true ) {
      local_238._M_current =
           (FileInfo *)
           std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)local_e0);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                          *)&mit,&local_238);
      if (!bVar3) break;
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"",&local_259);
      handleAction(this,&pFVar4->Filepath,2,(string *)local_258);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      local_268 = (FileInfo *)
                  __gnu_cxx::
                  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                  ::operator++((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                                *)&mit,0);
    }
    local_270 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                   ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                            *)&Diff.FilesModified.
                               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1a8._M_current = local_270;
    while( true ) {
      local_278._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     *)&Diff.FilesModified.
                        super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_1a8,&local_278);
      if (!bVar3) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
               ::operator*(&local_1a8);
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string(local_298,(string *)ppVar6);
      handleAction(this,&(ppVar5->second).Filepath,4,(string *)local_298);
      std::__cxx11::string::~string(local_298);
      local_2a0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                   *)__gnu_cxx::
                     __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
                     ::operator++(&local_1a8,0);
    }
    local_2a8 = (FileInfo *)
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.DirsDeleted.
                            super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    mit._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
          *)local_2a8;
    while( true ) {
      local_2b0._M_current =
           (FileInfo *)
           std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.DirsDeleted.
                       super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                          *)&mit,&local_2b0);
      if (!bVar3) break;
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::__cxx11::string::string(local_2d0,(string *)pFVar4);
      createDirectory(this,(string *)local_2d0);
      std::__cxx11::string::~string(local_2d0);
      local_2d8 = (FileInfo *)
                  __gnu_cxx::
                  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                  ::operator++((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                                *)&mit,0);
    }
    local_2e0 = (FileInfo *)
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.DirsCreated.
                            super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    mit._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
          *)local_2e0;
    while( true ) {
      local_2e8._M_current =
           (FileInfo *)
           std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.DirsCreated.
                       super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                          *)&mit,&local_2e8);
      if (!bVar3) break;
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_308,"",&local_309);
      handleAction(this,&pFVar4->Filepath,3,(string *)local_308);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      local_318 = (FileInfo *)
                  __gnu_cxx::
                  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                  ::operator++((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                                *)&mit,0);
    }
    local_320 = (FileInfo *)
                std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                          ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                           &Diff.FilesMoved.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    mit._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
          *)local_320;
    while( true ) {
      local_328._M_current =
           (FileInfo *)
           std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                     ((vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                      &Diff.FilesMoved.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                          *)&mit,&local_328);
      if (!bVar3) break;
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_348,"",&local_349);
      handleAction(this,&pFVar4->Filepath,2,(string *)local_348);
      std::__cxx11::string::~string(local_348);
      std::allocator<char>::~allocator((allocator<char> *)&local_349);
      pFVar4 = __gnu_cxx::
               __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
               ::operator*((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                            *)&mit);
      std::__cxx11::string::string(local_370,(string *)pFVar4);
      removeDirectory(this,(string *)local_370);
      std::__cxx11::string::~string(local_370);
      local_378 = (FileInfo *)
                  __gnu_cxx::
                  __normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                  ::operator++((__normal_iterator<efsw::FileInfo_*,_std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>_>
                                *)&mit,0);
    }
    local_380 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                   ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                            *)&Diff.DirsModified.
                               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1a8._M_current = local_380;
    while( true ) {
      local_388._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     *)&Diff.DirsModified.
                        super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_1a8,&local_388);
      if (!bVar3) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
               ::operator*(&local_1a8);
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string(local_3a8,(string *)ppVar6);
      handleAction(this,&(ppVar5->second).Filepath,4,(string *)local_3a8);
      std::__cxx11::string::~string(local_3a8);
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string(local_3c8,(string *)ppVar5);
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
               ::operator*(&local_1a8);
      std::__cxx11::string::string(local_3e8,(string *)&ppVar5->second);
      moveDirectory(this,(string *)local_3c8,(string *)local_3e8);
      std::__cxx11::string::~string(local_3e8);
      std::__cxx11::string::~string(local_3c8);
      dit._M_node = (_Base_ptr)
                    __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>_>
                    ::operator++(&local_1a8,0);
    }
  }
  local_3f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
       ::begin(&this->Directories);
  while( true ) {
    local_400._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
         ::end(&this->Directories);
    bVar3 = std::operator!=(&local_3f8,&local_400);
    if (!bVar3) break;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_3f8);
    watch(ppVar7->second,false);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
    ::operator++(&local_3f8);
  }
  DirectorySnapshotDiff::~DirectorySnapshotDiff((DirectorySnapshotDiff *)local_e0);
  return;
}

Assistant:

void DirWatcherGeneric::watch( bool reportOwnChange ) {
	DirectorySnapshotDiff Diff = DirSnap.scan();

	if ( reportOwnChange && Diff.DirChanged && NULL != Parent ) {
		Watch->Listener->handleFileAction(
			Watch->ID, FileSystem::pathRemoveFileName( DirSnap.DirectoryInfo.Filepath ),
			FileSystem::fileNameFromPath( DirSnap.DirectoryInfo.Filepath ), Actions::Modified );
	}

	if ( Diff.changed() ) {
		FileInfoList::iterator it;
		MovedList::iterator mit;

		/// Files
		DiffIterator( FilesCreated ) {
			handleAction( ( *it ).Filepath, Actions::Add );
		}

		DiffIterator( FilesModified ) {
			handleAction( ( *it ).Filepath, Actions::Modified );
		}

		DiffIterator( FilesDeleted ) {
			handleAction( ( *it ).Filepath, Actions::Delete );
		}

		DiffMovedIterator( FilesMoved ) {
			handleAction( ( *mit ).second.Filepath, Actions::Moved, ( *mit ).first );
		}

		/// Directories
		DiffIterator( DirsCreated ) {
			createDirectory( ( *it ).Filepath );
		}

		DiffIterator( DirsModified ) {
			handleAction( ( *it ).Filepath, Actions::Modified );
		}

		DiffIterator( DirsDeleted ) {
			handleAction( ( *it ).Filepath, Actions::Delete );
			removeDirectory( ( *it ).Filepath );
		}

		DiffMovedIterator( DirsMoved ) {
			handleAction( ( *mit ).second.Filepath, Actions::Moved, ( *mit ).first );
			moveDirectory( ( *mit ).first, ( *mit ).second.Filepath );
		}
	}

	/// Process the subdirectories looking for changes
	for ( DirWatchMap::iterator dit = Directories.begin(); dit != Directories.end(); ++dit ) {
		/// Just watch
		dit->second->watch();
	}
}